

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

bool Cipher::saveFreqMapBinary(char *fname,TFreqMap *freqMap)

{
  _Node_const_iterator<std::pair<const_int,_float>,_false,_false> __last;
  _Node_const_iterator<std::pair<const_int,_float>,_false,_false> __first;
  byte bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  reference pvVar7;
  mapped_type_conflict *pmVar8;
  long in_RSI;
  char *in_RDI;
  uint8_t d;
  int i_1;
  uint8_t n_1;
  int32_t ie;
  int32_t is;
  type *p;
  type *i;
  iterator __end2;
  iterator __begin2;
  map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *__range2;
  vector<int,_std::allocator<int>_> keys;
  map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> sorted;
  int32_t n;
  ofstream fout;
  unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
  *in_stack_fffffffffffffd08;
  _Rb_tree_iterator<std::pair<const_int,_float>_> *in_stack_fffffffffffffd10;
  vector<int,_std::allocator<int>_> *this;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  value_type in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd30;
  undefined2 in_stack_fffffffffffffd34;
  undefined1 in_stack_fffffffffffffd37;
  undefined4 in_stack_fffffffffffffd38;
  int iVar9;
  undefined4 in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  int iVar10;
  type *in_stack_fffffffffffffd48;
  map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
  *in_stack_fffffffffffffd50;
  _Self local_2a0;
  _Self local_298;
  undefined1 *local_290;
  vector<int,_std::allocator<int>_> local_288;
  _Node_iterator_base<std::pair<const_int,_float>,_false> local_270;
  _Node_iterator_base<std::pair<const_int,_float>,_false> local_268;
  undefined1 local_260 [52];
  undefined4 local_22c;
  undefined4 local_228;
  char local_218 [512];
  long local_18;
  char *local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::ofstream::ofstream(local_218,in_RDI,_S_bin);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    printf("    Failed to open file \'%s\'\n",local_10);
    local_1 = 0;
  }
  else {
    std::ostream::write(local_218,local_18);
    std::ostream::write(local_218,local_18 + 8);
    std::ostream::write(local_218,local_18 + 0x10);
    sVar5 = std::
            unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
            ::size((unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                    *)0x1b74e4);
    local_22c = (undefined4)sVar5;
    std::ostream::write(local_218,(long)&local_22c);
    local_268._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
         ::begin(in_stack_fffffffffffffd08);
    local_270._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
         ::end(in_stack_fffffffffffffd08);
    __first.super__Node_iterator_base<std::pair<const_int,_float>,_false>._M_cur._4_4_ =
         in_stack_fffffffffffffd44;
    __first.super__Node_iterator_base<std::pair<const_int,_float>,_false>._M_cur._0_4_ =
         in_stack_fffffffffffffd40;
    __last.super__Node_iterator_base<std::pair<const_int,_float>,_false>._M_cur._4_4_ =
         in_stack_fffffffffffffd3c;
    __last.super__Node_iterator_base<std::pair<const_int,_float>,_false>._M_cur._0_4_ =
         in_stack_fffffffffffffd38;
    std::map<int,float,std::less<int>,std::allocator<std::pair<int_const,float>>>::
    map<std::__detail::_Node_const_iterator<std::pair<int_const,float>,false,false>>
              ((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *)
               CONCAT17(in_stack_fffffffffffffd37,
                        CONCAT16(bVar1,CONCAT24(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                                )),__first,__last);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1b7562);
    local_290 = local_260;
    local_298._M_node =
         (_Base_ptr)
         std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::begin
                   ((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                     *)in_stack_fffffffffffffd08);
    local_2a0._M_node =
         (_Base_ptr)
         std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::end
                   ((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                     *)in_stack_fffffffffffffd08);
    while (bVar2 = std::operator!=(&local_298,&local_2a0), bVar2) {
      std::_Rb_tree_iterator<std::pair<const_int,_float>_>::operator*
                ((_Rb_tree_iterator<std::pair<const_int,_float>_> *)0x1b75af);
      in_stack_fffffffffffffd50 =
           (map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *)
           std::get<0ul,int_const,float>((pair<const_int,_float> *)0x1b75be);
      in_stack_fffffffffffffd48 = std::get<1ul,int_const,float>((pair<const_int,_float> *)0x1b75cd);
      if ((*in_stack_fffffffffffffd48 != *(float *)(local_18 + 0x10)) ||
         (NAN(*in_stack_fffffffffffffd48) || NAN(*(float *)(local_18 + 0x10)))) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      }
      std::_Rb_tree_iterator<std::pair<const_int,_float>_>::operator++(in_stack_fffffffffffffd10);
    }
    iVar10 = 0;
    while (iVar9 = iVar10, sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_288),
          iVar10 < (int)sVar6) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_288,(long)iVar9);
      std::ostream::write(local_218,(long)pvVar7);
      std::vector<int,_std::allocator<int>_>::operator[](&local_288,(long)iVar9);
      pmVar8 = std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
               operator[](in_stack_fffffffffffffd50,(key_type_conflict *)in_stack_fffffffffffffd48);
      in_stack_fffffffffffffd24 = iVar9;
      std::ostream::write(local_218,(long)pmVar8);
      iVar9 = in_stack_fffffffffffffd24;
      sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_288);
      if (in_stack_fffffffffffffd24 == (int)sVar6 + -1) break;
      iVar10 = iVar9 + 1;
      while( true ) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_288,(long)iVar10);
        in_stack_fffffffffffffd20 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_288,(long)(iVar10 + -1));
        if (0xff < in_stack_fffffffffffffd20 - *pvVar7) break;
        iVar4 = iVar10 + 1;
        iVar10 = iVar4;
        sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_288);
        if ((iVar4 == (int)sVar6) || (iVar10 == iVar9 + 0xff)) break;
      }
      cVar3 = ((char)iVar10 - (char)iVar9) + -1;
      std::ostream::write(local_218,(long)&stack0xfffffffffffffd3f);
      if (cVar3 != '\0') {
        while (iVar9 = iVar9 + 1, iVar9 < iVar10) {
          this = &local_288;
          std::vector<int,_std::allocator<int>_>::operator[](this,(long)iVar9);
          std::vector<int,_std::allocator<int>_>::operator[](this,(long)(iVar9 + -1));
          std::ostream::write(local_218,(long)&stack0xfffffffffffffd37);
          std::vector<int,_std::allocator<int>_>::operator[](&local_288,(long)iVar9);
          pmVar8 = std::
                   map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
                   operator[](in_stack_fffffffffffffd50,
                              (key_type_conflict *)in_stack_fffffffffffffd48);
          std::ostream::write(local_218,(long)pmVar8);
        }
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
    std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::~map
              ((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *)
               0x1b788d);
    local_1 = 1;
  }
  local_228 = 1;
  std::ofstream::~ofstream(local_218);
  return (bool)(local_1 & 1);
}

Assistant:

bool saveFreqMapBinary(const char * fname, const TFreqMap & freqMap) {
        std::ofstream fout(fname, std::ios::binary);
        if (fout.good() == false) {
            printf("    Failed to open file '%s'\n", fname);
            return false;
        }

        fout.write((const char *) &freqMap.len,    sizeof(freqMap.len));
        fout.write((const char *) &freqMap.nTotal, sizeof(freqMap.nTotal));
        fout.write((const char *) &freqMap.pmin,   sizeof(freqMap.pmin));

        { int32_t n = freqMap.prob.size(); fout.write((const char *) &n, sizeof(n)); }

        {
            std::map<TCode, TProb> sorted(freqMap.prob.begin(), freqMap.prob.end());

            std::vector<TCode> keys;
            for (const auto & [i, p] : sorted) {
                if (p == freqMap.pmin) {
                    continue;
                }
                keys.push_back(i);
            }

            int32_t is = 0;
            while (is < (int) keys.size()) {
                fout.write((const char *) &keys[is],         sizeof(keys[is]));
                fout.write((const char *) &sorted[keys[is]], sizeof(sorted[keys[is]]));

                if (is == (int) keys.size() - 1) break;

                int32_t ie = is + 1;
                while (keys[ie] - keys[ie - 1] < 256) {
                    ++ie;
                    if (ie == (int) keys.size()) break;
                    if (ie == is + 255) break;
                }

                uint8_t n = (uint8_t) (ie - is - 1);
                fout.write((const char *) &n, sizeof(n));
                if (n > 0) {
                    for (int i = is + 1; i < ie; ++i) {
                        uint8_t d = (uint8_t) (keys[i] - keys[i - 1]);
                        fout.write((const char *) &d,               sizeof(d));
                        fout.write((const char *) &sorted[keys[i]], sizeof(sorted[keys[i]]));
                    }
                }

                is = ie;
            }
        }

        return true;
    }